

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_pause(CURL *curl,int action)

{
  uint uVar1;
  int type;
  char *pcVar2;
  CURLcode CVar3;
  void *__dest;
  char *ptr;
  size_t len;
  ulong __n;
  
  uVar1 = (action & 1U) * 0x10 + (action & 4U) * 8;
  *(uint *)((long)curl + 0x174) = *(uint *)((long)curl + 0x174) & 0xffffffcf | uVar1;
  CVar3 = CURLE_OK;
  if (((action & 1U) == 0) && (pcVar2 = *(char **)((long)curl + 0x88b0), pcVar2 != (char *)0x0)) {
    __n = *(ulong *)((long)curl + 35000);
    type = *(int *)((long)curl + 0x88c0);
    *(undefined8 *)((long)curl + 0x88b0) = 0;
    ptr = pcVar2;
    do {
      len = 0x4000;
      if (__n < 0x4000) {
        len = __n;
      }
      CVar3 = Curl_client_write(*(connectdata **)((long)curl + 0x10),type,ptr,len);
      if (CVar3 != CURLE_OK) goto LAB_004e83c5;
      if (0x4000 < __n && *(void **)((long)curl + 0x88b0) != (void *)0x0) {
        __dest = (*Curl_crealloc)(*(void **)((long)curl + 0x88b0),__n);
        if (__dest == (void *)0x0) {
          (*Curl_cfree)(*(void **)((long)curl + 0x88b0));
          *(undefined8 *)((long)curl + 0x88b0) = 0;
          CVar3 = CURLE_OUT_OF_MEMORY;
          goto LAB_004e83c5;
        }
        *(void **)((long)curl + 0x88b0) = __dest;
        memcpy(__dest,ptr,__n);
        *(ulong *)((long)curl + 35000) = __n;
        break;
      }
      ptr = ptr + len;
      __n = __n - len;
    } while (__n != 0);
    CVar3 = CURLE_OK;
LAB_004e83c5:
    (*Curl_cfree)(pcVar2);
  }
  if (uVar1 != 0x30 && CVar3 == CURLE_OK) {
    Curl_expire((SessionHandle *)curl,1);
  }
  return CVar3;
}

Assistant:

CURLcode curl_easy_pause(CURL *curl, int action)
{
  struct SessionHandle *data = (struct SessionHandle *)curl;
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;

  /* first switch off both pause bits */
  int newstate = k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* set the new desired pause bits */
  newstate |= ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE) && data->state.tempwrite) {
    /* we have a buffer for sending that we now seem to be able to deliver
       since the receive pausing is lifted! */

    /* get the pointer, type and length in local copies since the function may
       return PAUSE again and then we'll get a new copy allocted and stored in
       the tempwrite variables */
    char *tempwrite = data->state.tempwrite;
    char *freewrite = tempwrite; /* store this pointer to free it later */
    size_t tempsize = data->state.tempwritesize;
    int temptype = data->state.tempwritetype;
    size_t chunklen;

    /* clear tempwrite here just to make sure it gets cleared if there's no
       further use of it, and make sure we don't clear it after the function
       invoke as it may have been set to a new value by then */
    data->state.tempwrite = NULL;

    /* since the write callback API is define to never exceed
       CURL_MAX_WRITE_SIZE bytes in a single call, and since we may in fact
       have more data than that in our buffer here, we must loop sending the
       data in multiple calls until there's no data left or we get another
       pause returned.

       A tricky part is that the function we call will "buffer" the data
       itself when it pauses on a particular buffer, so we may need to do some
       extra trickery if we get a pause return here.
    */
    do {
      chunklen = (tempsize > CURL_MAX_WRITE_SIZE)?CURL_MAX_WRITE_SIZE:tempsize;

      result = Curl_client_write(data->easy_conn,
                                 temptype, tempwrite, chunklen);
      if(result)
        /* failures abort the loop at once */
        break;

      if(data->state.tempwrite && (tempsize - chunklen)) {
        /* Ouch, the reading is again paused and the block we send is now
           "cached". If this is the final chunk we can leave it like this, but
           if we have more chunks that are cached after this, we need to free
           the newly cached one and put back a version that is truly the entire
           contents that is saved for later
        */
        char *newptr;

        /* note that tempsize is still the size as before the callback was
           used, and thus the whole piece of data to keep */
        newptr = realloc(data->state.tempwrite, tempsize);

        if(!newptr) {
          free(data->state.tempwrite); /* free old area */
          data->state.tempwrite = NULL;
          result = CURLE_OUT_OF_MEMORY;
          /* tempwrite will be freed further down */
          break;
        }
        data->state.tempwrite = newptr; /* store new pointer */
        memcpy(newptr, tempwrite, tempsize);
        data->state.tempwritesize = tempsize; /* store new size */
        /* tempwrite will be freed further down */
        break; /* go back to pausing until further notice */
      }
      else {
        tempsize -= chunklen;  /* left after the call above */
        tempwrite += chunklen; /* advance the pointer */
      }

    } while((result == CURLE_OK) && tempsize);

    free(freewrite); /* this is unconditionally no longer used */
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if(!result &&
     ((newstate&(KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
      (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) )
    Curl_expire(data, 1); /* get this handle going again */

  return result;
}